

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

int setlineno(int n)

{
  line *local_18;
  line *clp;
  int n_local;
  
  clp._4_4_ = n;
  if (n < 0) {
    curwp->w_dotline = curwp->w_bufp->b_lines + n;
    local_18 = curbp->b_headp->l_bp;
    for (; clp._4_4_ < 0; clp._4_4_ = clp._4_4_ + 1) {
      if (local_18->l_bp == curbp->b_headp) {
        curwp->w_dotline = 1;
        break;
      }
      local_18 = local_18->l_bp;
    }
  }
  else {
    if (n == 0) {
      clp._4_4_ = 1;
    }
    curwp->w_dotline = clp._4_4_;
    local_18 = curbp->b_headp->l_fp;
    while (clp._4_4_ = clp._4_4_ + -1, 0 < clp._4_4_) {
      if (local_18->l_fp == curbp->b_headp) {
        curwp->w_dotline = curwp->w_bufp->b_lines;
        break;
      }
      local_18 = local_18->l_fp;
    }
  }
  curwp->w_dotp = local_18;
  curwp->w_doto = 0;
  curwp->w_rflag = curwp->w_rflag | 2;
  return 1;
}

Assistant:

int
setlineno(int n)
{
	struct line  *clp;

	if (n >= 0) {
		if (n == 0)
			n++;
		curwp->w_dotline = n;
		clp = lforw(curbp->b_headp);	/* "clp" is first line */
		while (--n > 0) {
			if (lforw(clp) == curbp->b_headp) {
				curwp->w_dotline = curwp->w_bufp->b_lines;
				break;
			}
			clp = lforw(clp);
		}
	} else {
		curwp->w_dotline = curwp->w_bufp->b_lines + n;
		clp = lback(curbp->b_headp);	/* "clp" is last line */
		while (n < 0) {
			if (lback(clp) == curbp->b_headp) {
				curwp->w_dotline = 1;
				break;
			}
			clp = lback(clp);
			n++;
		}
	}
	curwp->w_dotp = clp;
	curwp->w_doto = 0;
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}